

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

bool __thiscall ObjectFile::getBooleanValue(ObjectFile *this,CK_ATTRIBUTE_TYPE type,bool val)

{
  OSAttribute *this_00;
  byte bVar1;
  mapped_type *ppOVar2;
  byte in_DL;
  undefined8 in_RSI;
  OSAttribute *attr;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  key_type *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = in_DL & 1;
  MutexLocker::MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             in_stack_ffffffffffffff98);
  ppOVar2 = std::
            map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
            ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                          *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  this_00 = *ppOVar2;
  if (this_00 == (OSAttribute *)0x0) {
    softHSMLog(3,"getBooleanValue",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x7d,"The attribute does not exist: 0x%08X",in_RSI);
    local_1 = (bool)(bVar1 & 1);
  }
  else {
    in_stack_ffffffffffffffa7 = OSAttribute::isBooleanAttribute(this_00);
    if ((bool)in_stack_ffffffffffffffa7) {
      in_stack_ffffffffffffffa6 = OSAttribute::getBooleanValue(this_00);
      local_1 = (bool)in_stack_ffffffffffffffa6;
    }
    else {
      softHSMLog(3,"getBooleanValue",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x87,"The attribute is not a boolean: 0x%08X",in_RSI);
      local_1 = (bool)(bVar1 & 1);
    }
  }
  MutexLocker::~MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  return local_1;
}

Assistant:

bool ObjectFile::getBooleanValue(CK_ATTRIBUTE_TYPE type, bool val)
{
	MutexLocker lock(objectMutex);

	OSAttribute* attr = attributes[type];
	if (attr == NULL)
	{
		ERROR_MSG("The attribute does not exist: 0x%08X", type);
		return val;
	}

	if (attr->isBooleanAttribute())
	{
		return attr->getBooleanValue();
	}
	else
	{
		ERROR_MSG("The attribute is not a boolean: 0x%08X", type);
		return val;
	}
}